

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O2

void test_abs<unsigned_int>(uint length)

{
  uint *__p;
  ulong uVar1;
  ulong uVar2;
  undefined4 *local_28;
  shared_ptr<unsigned_int> pv;
  
  __p = sse::common::malloc<unsigned_int>(length);
  std::__shared_ptr<unsigned_int,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_int,void(*)(unsigned_int*),void>
            ((__shared_ptr<unsigned_int,(__gnu_cxx::_Lock_policy)2> *)&local_28,__p,
             sse::common::free<unsigned_int>);
  uVar1 = 0;
  uVar2 = (ulong)length;
  if ((int)length < 1) {
    uVar2 = uVar1;
  }
  for (; -uVar1 != uVar2; uVar1 = uVar1 - 1) {
    *local_28 = (int)uVar1;
    local_28 = local_28 + 1;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv);
  return;
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}